

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

float * __thiscall llama_context::get_embeddings_ith(llama_context *this,int32_t i)

{
  pointer piVar1;
  ulong uVar2;
  runtime_error *prVar3;
  int iVar4;
  uint uVar5;
  string sStack_48;
  
  uVar2 = (ulong)(uint)i;
  if (this->embd == (float *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"no embeddings");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (i < 0) {
    iVar4 = this->n_outputs;
    uVar5 = iVar4 + i;
    if ((int)uVar5 < 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&sStack_48,"negative index out of range [0, %d)",
                        (ulong)(uint)this->n_outputs);
      std::runtime_error::runtime_error(prVar3,(string *)&sStack_48);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    piVar1 = (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar2) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&sStack_48,"out of range [0, %zu)",
                        (long)(this->output_ids).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->output_ids).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2);
      std::runtime_error::runtime_error(prVar3,(string *)&sStack_48);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar5 = piVar1[uVar2];
    if ((int)uVar5 < 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&sStack_48,"batch.logits[%d] != true",uVar2);
      std::runtime_error::runtime_error(prVar3,(string *)&sStack_48);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = this->n_outputs;
  }
  if ((int)uVar5 < iVar4) {
    return this->embd + uVar5 * (this->model->hparams).n_embd;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  format_abi_cxx11_(&sStack_48,"corrupt output buffer (j=%d, n_outputs=%d)",(ulong)uVar5,
                    (ulong)(uint)this->n_outputs);
  std::runtime_error::runtime_error(prVar3,(string *)&sStack_48);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float * llama_context::get_embeddings_ith(int32_t i) {
    int32_t j = -1;

    try {
        if (embd == nullptr) {
            throw std::runtime_error("no embeddings");
        }

        if (i < 0) {
            j = n_outputs + i;
            if (j < 0) {
                throw std::runtime_error(format("negative index out of range [0, %d)", n_outputs));
            }
        } else if ((size_t) i >= output_ids.size()) {
            throw std::runtime_error(format("out of range [0, %zu)", output_ids.size()));
        } else {
            j = output_ids[i];
        }

        if (j < 0) {
            throw std::runtime_error(format("batch.logits[%d] != true", i));
        }
        if (j >= n_outputs) {
            // This should not happen
            throw std::runtime_error(format("corrupt output buffer (j=%d, n_outputs=%d)", j, n_outputs));
        }

        return embd + j*model.hparams.n_embd;
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: invalid embeddings id %d, reason: %s\n", __func__, i, err.what());
#ifndef NDEBUG
        GGML_ABORT("fatal error");
#else
        return nullptr;
#endif
    }
}